

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 GenStateEnterBlock(jx9_gen_state *pGen,sxi32 iType,sxu32 nFirstInstr,void *pUserData,
                        GenBlock **ppBlock)

{
  jx9_vm *pjVar1;
  GenBlock *pGVar2;
  sxi32 sVar3;
  ulong uVar4;
  
  pGVar2 = (GenBlock *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator,0x78);
  if (pGVar2 == (GenBlock *)0x0) {
    jx9GenCompileError(pGen,1,1,"Fatal, Jx9 compiler is running out of memory");
    sVar3 = -10;
  }
  else {
    uVar4 = 0xfffffffffffffffc;
    do {
      *(undefined4 *)((long)&pGVar2->pGen + uVar4 + 4) = 0;
      uVar4 = uVar4 + 4;
    } while (uVar4 < 0x74);
    pGVar2->nFirstInstr = nFirstInstr;
    pGVar2->pUserData = pUserData;
    pGVar2->pGen = pGen;
    pGVar2->iFlags = iType;
    sVar3 = 0;
    pGVar2->pParent = (GenBlock *)0x0;
    pGVar2->bPostContinue = '\0';
    pjVar1 = pGen->pVm;
    (pGVar2->aJumpFix).nUsed = 0;
    (pGVar2->aJumpFix).nSize = 0;
    (pGVar2->aJumpFix).eSize = 8;
    (pGVar2->aJumpFix).nCursor = 0;
    (pGVar2->aJumpFix).pAllocator = &pjVar1->sAllocator;
    (pGVar2->aJumpFix).pBase = (void *)0x0;
    (pGVar2->aJumpFix).pUserData = (void *)0x0;
    (pGVar2->aPostContFix).eSize = 8;
    (pGVar2->aPostContFix).nCursor = 0;
    (pGVar2->aPostContFix).pAllocator = &pjVar1->sAllocator;
    (pGVar2->aPostContFix).pBase = (void *)0x0;
    (pGVar2->aPostContFix).nUsed = 0;
    (pGVar2->aPostContFix).nSize = 0;
    (pGVar2->aPostContFix).pUserData = (void *)0x0;
    pGVar2->pParent = pGen->pCurrent;
    pGen->pCurrent = pGVar2;
    if (ppBlock != (GenBlock **)0x0) {
      *ppBlock = pGVar2;
    }
  }
  return sVar3;
}

Assistant:

static sxi32 GenStateEnterBlock(
	jx9_gen_state *pGen,  /* Code generator state */
	sxi32 iType,          /* Block type [i.e: loop, conditional, function body, etc.]*/
	sxu32 nFirstInstr,    /* First instruction to compile */
	void *pUserData,      /* Upper layer private data */
	GenBlock **ppBlock    /* OUT: instantiated block */
	)
{
	GenBlock *pBlock;
	/* Allocate a new block instance */
	pBlock = (GenBlock *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator, sizeof(GenBlock));
	if( pBlock == 0 ){
		/* If the supplied memory subsystem is so sick that we are unable to allocate
		 * a tiny chunk of memory, there is no much we can do here.
		 */
		return GenStateOutOfMem(pGen);
	}
	/* Zero the structure */
	SyZero(pBlock, sizeof(GenBlock));
	GenStateInitBlock(&(*pGen), pBlock, iType, nFirstInstr, pUserData);
	/* Link to the parent block */
	pBlock->pParent = pGen->pCurrent;
	/* Mark as the current block */
	pGen->pCurrent = pBlock;
	if( ppBlock ){
		/* Write a pointer to the new instance */
		*ppBlock = pBlock;
	}
	return SXRET_OK;
}